

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_resp_to_str(HttpResponse *resp,char *dest)

{
  char *key;
  char **ppcVar1;
  size_t sVar2;
  map_iter_t mVar3;
  undefined1 local_38 [8];
  map_iter_t iter;
  char *value;
  char *header;
  char *dest_local;
  HttpResponse *resp_local;
  
  snprintf(dest,10000,"HTTP/1.1 %u\r\n",(ulong)resp->status_code);
  mVar3 = map_iter_();
  iter._0_8_ = mVar3.node;
  local_38._0_4_ = mVar3.bucketidx;
  while( true ) {
    key = map_next_(&(resp->headers).base,(map_iter_t *)local_38);
    if (key == (char *)0x0) break;
    ppcVar1 = (char **)map_get_(&(resp->headers).base,key);
    (resp->headers).ref = ppcVar1;
    iter.node = (map_node_t *)*ppcVar1;
    sVar2 = strlen(dest);
    snprintf(dest + sVar2,10000,"%s: %s\r\n",key,iter.node);
  }
  strcat(dest,"\r\n");
  strcat(dest,resp->data);
  return;
}

Assistant:

void parse_resp_to_str(HttpResponse *resp, char *dest) {
    snprintf(dest, DATA_LENGTH, "HTTP/1.1 %u"CRLF, resp->status_code);
    const char *header;
    const char *value;
    map_iter_t iter = map_iter(&resp->headers);
    while ((header = map_next(&resp->headers, &iter))) {
        value = *map_get(&resp->headers, header);
        snprintf(dest + strlen(dest), DATA_LENGTH, "%s: %s"CRLF, header, value);
    }
    strcat(dest, CRLF);
    strcat(dest, resp->data);
}